

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O0

int zReadValues(FILE *fp,int n,doublecomplex *destination,int perline,int persize)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  char local_b8 [8];
  char buf [100];
  double dStack_48;
  char tmp;
  double realpart;
  int pair;
  int s;
  int k;
  int j;
  int i;
  int persize_local;
  int perline_local;
  doublecomplex *destination_local;
  int n_local;
  FILE *fp_local;
  
  bVar2 = false;
  k = 0;
  while (k < n) {
    fgets(local_b8,100,(FILE *)fp);
    for (s = 0; s < perline && k < n; s = s + 1) {
      cVar1 = local_b8[(s + 1) * persize];
      local_b8[(s + 1) * persize] = '\0';
      iVar3 = s * persize;
      for (pair = 0; pair < persize; pair = pair + 1) {
        if ((local_b8[iVar3 + pair] == 'D') || (local_b8[iVar3 + pair] == 'd')) {
          local_b8[iVar3 + pair] = 'E';
        }
      }
      if (bVar2) {
        destination[k].r = dStack_48;
        dVar4 = atof(local_b8 + iVar3);
        destination[k].i = dVar4;
        k = k + 1;
      }
      else {
        dStack_48 = atof(local_b8 + iVar3);
      }
      bVar2 = !bVar2;
      local_b8[(s + 1) * persize] = cVar1;
    }
  }
  return 0;
}

Assistant:

int zReadValues(FILE *fp, int n, doublecomplex *destination, int perline, int persize)
{
    register int i, j, k, s, pair;
    register double realpart;
    char tmp, buf[100];
    
    i = pair = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    if ( pair == 0 ) {
	  	/* The value is real part */
		realpart = atof(&buf[s]);
		pair = 1;
	    } else {
		/* The value is imaginary part */
	        destination[i].r = realpart;
		destination[i++].i = atof(&buf[s]);
		pair = 0;
	    }
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}